

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

void ImPlot::SetPlotQuery(ImPlotLimits *query,ImPlotYAxis y_axis)

{
  ImPlotPlot *pIVar1;
  undefined1 auVar2 [16];
  ImVec2 IVar3;
  ImVec2 IVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar7;
  float fVar8;
  ImVec2 IVar9;
  undefined1 auVar10 [16];
  ImVec2 IVar11;
  ImPlotPoint local_30;
  
  if (3 < y_axis + 1U) {
    __assert_fail("(y_axis >= -1 && y_axis < 3) && \"y_axis needs to between -1 and IMPLOT_Y_AXES\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xad4,"void ImPlot::SetPlotQuery(const ImPlotLimits &, ImPlotYAxis)");
  }
  pIVar1 = GImPlot->CurrentPlot;
  if (pIVar1 != (ImPlotPlot *)0x0) {
    if (y_axis < 0) {
      y_axis = pIVar1->CurrentYAxis;
    }
    UpdateTransformCache();
    local_30.x = (query->X).Min;
    local_30.y = (query->Y).Min;
    IVar3 = PlotToPixels(&local_30,y_axis);
    auVar10._8_4_ = extraout_XMM0_Dc;
    auVar10._0_4_ = IVar3.x;
    auVar10._4_4_ = IVar3.y;
    auVar10._12_4_ = extraout_XMM0_Dd;
    local_30.x = (query->X).Max;
    local_30.y = (query->Y).Max;
    IVar4 = PlotToPixels(&local_30,y_axis);
    pIVar1->Querying = false;
    pIVar1->Queried = true;
    IVar11 = (pIVar1->PlotRect).Min;
    auVar2._8_4_ = extraout_XMM0_Dc_00;
    auVar2._0_4_ = IVar4.x;
    auVar2._4_4_ = IVar4.y;
    auVar2._12_4_ = extraout_XMM0_Dd_00;
    auVar10 = minps(auVar10,auVar2);
    fVar7 = IVar11.x;
    IVar9.x = auVar10._0_4_ - fVar7;
    fVar8 = IVar11.y;
    IVar9.y = auVar10._4_4_ - fVar8;
    uVar5 = -(uint)(IVar4.x <= IVar3.x);
    uVar6 = -(uint)(IVar4.y <= IVar3.y);
    IVar11.x = (float)(~uVar5 & (uint)IVar4.x | (uint)IVar3.x & uVar5) - fVar7;
    IVar11.y = (float)(~uVar6 & (uint)IVar4.y | (uint)IVar3.y & uVar6) - fVar8;
    (pIVar1->QueryRect).Min = IVar9;
    (pIVar1->QueryRect).Max = IVar11;
    return;
  }
  __assert_fail("(gp.CurrentPlot != __null) && \"GetPlotQuery() needs to be called between BeginPlot() and EndPlot()!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xad5,"void ImPlot::SetPlotQuery(const ImPlotLimits &, ImPlotYAxis)");
}

Assistant:

void SetPlotQuery(const ImPlotLimits& query, ImPlotYAxis y_axis) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(y_axis >= -1 && y_axis < IMPLOT_Y_AXES, "y_axis needs to between -1 and IMPLOT_Y_AXES");
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "GetPlotQuery() needs to be called between BeginPlot() and EndPlot()!");
    ImPlotPlot& plot = *gp.CurrentPlot;
    y_axis = y_axis >= 0 ? y_axis : gp.CurrentPlot->CurrentYAxis;
    UpdateTransformCache();
    ImVec2 p1 = PlotToPixels(query.Min(),y_axis);
    ImVec2 p2 = PlotToPixels(query.Max(),y_axis);
    plot.Queried = true;
    plot.Querying = false;
    plot.QueryRect = ImRect(ImMin(p1,p2)-plot.PlotRect.Min, ImMax(p1,p2)-plot.PlotRect.Min);
}